

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

uint64_t xorshift64star(uint64_t *pstate)

{
  ulong uVar1;
  uint64_t x;
  uint64_t *pstate_local;
  
  uVar1 = *pstate >> 0xc ^ *pstate;
  uVar1 = uVar1 << 0x19 ^ uVar1;
  uVar1 = uVar1 >> 0x1b ^ uVar1;
  *pstate = uVar1;
  return uVar1 * 0x2545f4914f6cdd1d;
}

Assistant:

static uint64_t xorshift64star(uint64_t *pstate)
{
    uint64_t x;
    x = *pstate;
    x ^= x >> 12;
    x ^= x << 25;
    x ^= x >> 27;
    *pstate = x;
    return x * 0x2545F4914F6CDD1D;
}